

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgestures.h
# Opt level: O1

void UpdateGestures(void)

{
  uint uVar1;
  
  if ((GESTURES.current - 1 < 2) && (GESTURES.Touch.pointCount < 2)) {
    GESTURES.current = 4;
    GESTURES.Hold.timeDuration = glfwGetTime();
  }
  uVar1 = GESTURES.current - 0x10 >> 4;
  if (((GESTURES.current << 0x1c | uVar1) < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    GESTURES.current = 0;
  }
  return;
}

Assistant:

void UpdateGestures(void)
{
    // NOTE: Gestures are processed through system callbacks on touch events

    // Detect GESTURE_HOLD
    if (((GESTURES.current == GESTURE_TAP) || (GESTURES.current == GESTURE_DOUBLETAP)) && (GESTURES.Touch.pointCount < 2))
    {
        GESTURES.current = GESTURE_HOLD;
        GESTURES.Hold.timeDuration = rgGetCurrentTime();
    }

    // Detect GESTURE_NONE
    if ((GESTURES.current == GESTURE_SWIPE_RIGHT) || (GESTURES.current == GESTURE_SWIPE_UP) || (GESTURES.current == GESTURE_SWIPE_LEFT) || (GESTURES.current == GESTURE_SWIPE_DOWN))
    {
        GESTURES.current = GESTURE_NONE;
    }
}